

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O2

void make_level_set3(vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *tri,
                    vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *x,Vec3f *origin,
                    float dx,int ni,int nj,int nk,Array3f *phi,int exact_band)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer pVVar9;
  pointer pVVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double x2;
  undefined1 auVar14 [16];
  ulong uVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *tri_00;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *x_00;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  float *pfVar26;
  int *piVar27;
  int iVar28;
  uint uVar29;
  int i;
  int iVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  int j;
  int iVar35;
  int total_count;
  uint uVar36;
  int k;
  int iVar37;
  int i_1;
  uint i_00;
  bool bVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  float fVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 in_XMM7_Da;
  undefined4 in_XMM7_Db;
  undefined8 in_XMM7_Qb;
  Vec3f local_1b0;
  int local_1a0;
  int local_19c;
  ulong local_198;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *local_190;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  Array3i intersection_count;
  Array3i closest_tri;
  double local_b8;
  double local_a8;
  ulong local_98;
  double local_88;
  double local_68;
  double local_58;
  
  Array3<float,_Array1<float>_>::resize(phi,ni,nj,nk);
  closest_tri.ni = (int)((float)(ni + nj + nk) * dx);
  Array1<float>::assign(&phi->a,(float *)&closest_tri);
  intersection_count.ni = -1;
  Array3<int,_Array1<int>_>::Array3(&closest_tri,ni,nj,nk,&intersection_count.ni);
  local_1b0.v._0_8_ = (ulong)(uint)local_1b0.v[1] << 0x20;
  local_198 = (ulong)(uint)nj;
  Array3<int,_Array1<int>_>::Array3(&intersection_count,ni,nj,nk,(int *)&local_1b0);
  dVar43 = (double)dx;
  local_1a0 = ni + -1;
  iVar22 = (int)local_198 + -1;
  iVar23 = nk + -1;
  uVar33 = 0;
  local_190 = tri;
  local_188 = x;
  do {
    x_00 = local_188;
    tri_00 = local_190;
    pVVar9 = (local_190->
             super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_190->
                       super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) / 0xc) <= uVar33)
    {
      iVar22 = 2;
      while (bVar38 = iVar22 != 0, iVar22 = iVar22 + -1, bVar38) {
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,1,1,1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,-1,-1,-1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,1,1,-1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,-1,-1,1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,1,-1,1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,-1,1,-1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,1,-1,-1);
        sweep(tri_00,x_00,phi,&closest_tri,origin,dx,-1,1,1);
      }
      uVar29 = (uint)local_198;
      for (uVar32 = 0; uVar32 != (~(nk >> 0x1f) & nk); uVar32 = uVar32 + 1) {
        for (uVar31 = 0; uVar31 != (~((int)uVar29 >> 0x1f) & uVar29); uVar31 = uVar31 + 1) {
          uVar36 = 0;
          for (i_00 = 0; (~(ni >> 0x1f) & ni) != i_00; i_00 = i_00 + 1) {
            piVar27 = Array3<int,_Array1<int>_>::operator()(&intersection_count,i_00,uVar31,uVar32);
            uVar36 = uVar36 + *piVar27;
            if ((uVar36 & 0x80000001) == 1) {
              pfVar26 = Array3<float,_Array1<float>_>::operator()(phi,i_00,uVar31,uVar32);
              fVar42 = *pfVar26;
              pfVar26 = Array3<float,_Array1<float>_>::operator()(phi,i_00,uVar31,uVar32);
              auVar41._8_4_ = 0x80000000;
              auVar41._0_8_ = 0x8000000080000000;
              auVar41._12_4_ = 0x80000000;
              auVar41 = vxorps_avx512vl(ZEXT416((uint)fVar42),auVar41);
              *pfVar26 = auVar41._0_4_;
            }
          }
        }
      }
      Array3<int,_Array1<int>_>::~Array3(&intersection_count);
      Array3<int,_Array1<int>_>::~Array3(&closest_tri);
      return;
    }
    uVar29 = pVVar9[uVar33].v[0];
    uVar32 = pVVar9[uVar33].v[1];
    uVar31 = pVVar9[uVar33].v[2];
    pVVar10 = (local_188->super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    auVar47._0_8_ = (double)origin->v[0];
    auVar52._0_8_ = ((double)pVVar10[uVar29].v[0] - auVar47._0_8_) / dVar43;
    auVar52._8_8_ = 0;
    auVar41 = vinsertps_avx(ZEXT416((uint)pVVar10[uVar32].v[0]),ZEXT416((uint)pVVar10[uVar31].v[0]),
                            0x10);
    auVar41 = vcvtps2pd_avx(auVar41);
    auVar47._8_8_ = auVar47._0_8_;
    auVar13 = vsubpd_avx(auVar41,auVar47);
    auVar41 = vinsertps_avx(ZEXT416((uint)pVVar10[uVar32].v[1]),ZEXT416((uint)pVVar10[uVar31].v[1]),
                            0x10);
    auVar41 = vcvtps2pd_avx(auVar41);
    auVar47 = vinsertps_avx(ZEXT416((uint)pVVar10[uVar32].v[2]),ZEXT416((uint)pVVar10[uVar31].v[2]),
                            0x10);
    auVar47 = vcvtps2pd_avx(auVar47);
    auVar14._8_8_ = dVar43;
    auVar14._0_8_ = dVar43;
    auVar13 = vdivpd_avx(auVar13,auVar14);
    auVar12 = vshufpd_avx(auVar13,auVar13,1);
    auVar11 = vminsd_avx(auVar12,auVar13);
    auVar11 = vminsd_avx(auVar11,auVar52);
    iVar28 = (int)auVar11._0_8_ - exact_band;
    iVar34 = local_1a0;
    if (iVar28 < local_1a0) {
      iVar34 = iVar28;
    }
    if (iVar28 < 0) {
      iVar34 = 0;
    }
    auVar11 = vmaxsd_avx(auVar12,auVar13);
    auVar11 = vmaxsd_avx(auVar11,auVar52);
    iVar28 = (int)auVar11._0_8_ + exact_band + 1;
    if (local_1a0 <= iVar28) {
      iVar28 = local_1a0;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(pVVar10[uVar29].v + 1);
    auVar1 = vcvtps2pd_avx(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(origin->v + 1);
    auVar2 = vcvtps2pd_avx(auVar2);
    if ((int)auVar11._0_8_ + exact_band < -1) {
      iVar28 = 0;
    }
    auVar11 = vsubpd_avx(auVar1,auVar2);
    auVar11 = vdivpd_avx(auVar11,auVar14);
    auVar44._8_8_ = auVar2._0_8_;
    auVar44._0_8_ = auVar2._0_8_;
    auVar41 = vsubpd_avx(auVar41,auVar44);
    auVar41 = vdivpd_avx(auVar41,auVar14);
    auVar1 = vshufpd_avx(auVar2,auVar2,3);
    auVar47 = vsubpd_avx(auVar47,auVar1);
    auVar47 = vdivpd_avx(auVar47,auVar14);
    auVar1 = vshufpd_avx(auVar41,auVar41,1);
    auVar2 = vshufpd_avx(auVar47,auVar47,1);
    auVar14 = vunpckhpd_avx(auVar41,auVar47);
    auVar44 = vunpcklpd_avx(auVar41,auVar47);
    auVar14 = vminpd_avx(auVar14,auVar44);
    uVar15 = vcmppd_avx512vl(auVar14,auVar11,1);
    bVar16 = (byte)(uVar15 & 3);
    dVar39 = (double)((ulong)(bVar16 & 1) * auVar14._0_8_ +
                     (ulong)!(bool)(bVar16 & 1) * (long)auVar11._0_8_);
    uVar15 = (uVar15 & 3) >> 1;
    iVar24 = (int)dVar39 - exact_band;
    local_19c = iVar22;
    if (iVar24 < iVar22) {
      local_19c = iVar24;
    }
    if (iVar24 < 0) {
      local_19c = 0;
    }
    auVar44 = vmaxsd_avx(auVar1,auVar41);
    auVar44 = vmaxsd_avx(auVar44,auVar11);
    local_178 = auVar44._0_8_;
    iVar24 = (int)local_178 + exact_band + 1;
    if (iVar22 <= iVar24) {
      iVar24 = iVar22;
    }
    if ((int)local_178 + exact_band < -1) {
      iVar24 = 0;
    }
    auVar14 = vshufpd_avx(auVar14,auVar14,1);
    auVar44 = vshufpd_avx(auVar11,auVar11,1);
    dVar40 = (double)(uVar15 * auVar14._0_8_ + (ulong)!SUB81(uVar15,0) * (long)auVar44._0_8_);
    iVar25 = (int)dVar40 - exact_band;
    iVar37 = iVar23;
    if (iVar25 < iVar23) {
      iVar37 = iVar25;
    }
    if (iVar25 < 0) {
      iVar37 = 0;
    }
    auVar14 = vmaxsd_avx(auVar2,auVar47);
    auVar14 = vmaxsd_avx(auVar14,auVar44);
    local_180 = auVar14._0_8_;
    iVar25 = (int)local_180 + exact_band + 1;
    if (iVar23 <= iVar25) {
      iVar25 = iVar23;
    }
    local_170 = auVar52._0_8_;
    if ((int)local_180 + exact_band < -1) {
      iVar25 = 0;
    }
    for (; iVar37 <= iVar25; iVar37 = iVar37 + 1) {
      for (iVar35 = local_19c; iVar35 <= iVar24; iVar35 = iVar35 + 1) {
        for (iVar30 = iVar34; iVar30 <= iVar28; iVar30 = iVar30 + 1) {
          auVar45._0_4_ = (float)iVar30;
          auVar45._8_8_ = in_XMM7_Qb;
          auVar45._4_4_ = in_XMM7_Db;
          auVar14 = vinsertps_avx(auVar45,ZEXT416((uint)(float)iVar35),0x10);
          auVar52 = vfmadd231ss_fma(ZEXT416((uint)origin->v[2]),ZEXT416((uint)(float)iVar37),
                                    ZEXT416((uint)dx));
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)origin->v;
          auVar21._4_4_ = dx;
          auVar21._0_4_ = dx;
          auVar21._8_4_ = dx;
          auVar21._12_4_ = dx;
          auVar14 = vfmadd231ps_fma(auVar50,auVar14,auVar21);
          local_1b0.v._0_8_ = vmovlps_avx(auVar14);
          local_1b0.v[2] = auVar52._0_4_;
          pVVar10 = (local_188->super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          fVar42 = point_triangle_distance
                             (&local_1b0,pVVar10 + uVar29,pVVar10 + uVar32,pVVar10 + uVar31);
          pfVar26 = Array3<float,_Array1<float>_>::operator()(phi,iVar30,iVar35,iVar37);
          if (fVar42 < *pfVar26) {
            pfVar26 = Array3<float,_Array1<float>_>::operator()(phi,iVar30,iVar35,iVar37);
            *pfVar26 = fVar42;
            piVar27 = Array3<int,_Array1<int>_>::operator()(&closest_tri,iVar30,iVar35,iVar37);
            *piVar27 = (int)uVar33;
          }
        }
      }
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar39;
    auVar17._4_4_ = in_XMM7_Db;
    auVar17._0_4_ = in_XMM7_Da;
    auVar17._8_8_ = in_XMM7_Qb;
    auVar14 = vroundsd_avx(auVar17,auVar3,10);
    iVar28 = (int)auVar14._0_8_;
    iVar34 = iVar22;
    if (iVar28 < iVar22) {
      iVar34 = iVar28;
    }
    if (iVar28 < 0) {
      iVar34 = 0;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_178;
    auVar18._4_4_ = in_XMM7_Db;
    auVar18._0_4_ = in_XMM7_Da;
    auVar18._8_8_ = in_XMM7_Qb;
    auVar14 = vroundsd_avx(auVar18,auVar4,9);
    iVar24 = (int)auVar14._0_8_;
    iVar28 = iVar22;
    if (iVar24 < iVar22) {
      iVar28 = iVar24;
    }
    if (iVar24 < 0) {
      iVar28 = 0;
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar40;
    auVar19._4_4_ = in_XMM7_Db;
    auVar19._0_4_ = in_XMM7_Da;
    auVar19._8_8_ = in_XMM7_Qb;
    auVar14 = vroundsd_avx(auVar19,auVar5,10);
    iVar37 = (int)auVar14._0_8_;
    iVar24 = iVar23;
    if (iVar37 < iVar23) {
      iVar24 = iVar37;
    }
    if (iVar37 < 0) {
      iVar24 = 0;
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_180;
    auVar20._4_4_ = in_XMM7_Db;
    auVar20._0_4_ = in_XMM7_Da;
    auVar20._8_8_ = in_XMM7_Qb;
    auVar14 = vroundsd_avx(auVar20,auVar6,9);
    iVar25 = (int)auVar14._0_8_;
    iVar37 = iVar23;
    if (iVar25 < iVar23) {
      iVar37 = iVar25;
    }
    if (iVar25 < 0) {
      iVar37 = 0;
    }
    for (; iVar24 <= iVar37; iVar24 = iVar24 + 1) {
      dVar40 = (double)iVar24;
      dVar39 = auVar44._0_8_ - dVar40;
      local_a8 = auVar47._0_8_;
      local_b8 = auVar2._0_8_;
      for (iVar25 = iVar34; iVar25 <= iVar28; iVar25 = iVar25 + 1) {
        dVar49 = (double)iVar25;
        local_58 = auVar41._0_8_;
        local_68 = auVar1._0_8_;
        iVar35 = orientation(local_58 - dVar49,local_a8 - dVar40,local_68 - dVar49,local_b8 - dVar40
                             ,(double *)&local_1b0);
        if (iVar35 != 0) {
          x2 = auVar11._0_8_ - dVar49;
          iVar30 = orientation(local_68 - dVar49,local_b8 - dVar40,x2,dVar39,&local_160);
          if ((iVar30 == iVar35) &&
             (iVar30 = orientation(x2,dVar39,local_58 - dVar49,local_a8 - dVar40,&local_168),
             iVar30 == iVar35)) {
            dVar49 = (double)local_1b0.v._0_8_ + local_160 + local_168;
            if ((dVar49 == 0.0) && (!NAN(dVar49))) {
              __assert_fail("sum!=0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/alecjacobson[P]SDFGen/makelevelset3.cpp"
                            ,0x6f,
                            "bool point_in_triangle_2d(double, double, double, double, double, double, double, double, double &, double &, double &)"
                           );
            }
            auVar46._0_8_ = (double)local_1b0.v._0_8_ / dVar49;
            auVar46._8_8_ = 0;
            auVar51._0_8_ = local_168 / dVar49;
            auVar51._8_8_ = 0;
            local_88 = auVar13._0_8_;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_170;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = (local_160 / dVar49) * local_88;
            auVar14 = vfmadd231sd_fma(auVar48,auVar46,auVar7);
            local_98 = auVar12._0_8_;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_98;
            auVar14 = vfmadd231sd_fma(auVar14,auVar51,auVar8);
            auVar14 = vroundsd_avx(auVar14,auVar14,10);
            iVar35 = (int)auVar14._0_8_;
            if (iVar35 < 0) {
              iVar35 = 0;
            }
            else if (ni <= iVar35) goto LAB_00105006;
            piVar27 = Array3<int,_Array1<int>_>::operator()
                                (&intersection_count,iVar35,iVar25,iVar24);
            *piVar27 = *piVar27 + 1;
          }
        }
LAB_00105006:
      }
    }
    uVar33 = (ulong)((int)uVar33 + 1);
  } while( true );
}

Assistant:

void make_level_set3(const std::vector<Vec3ui> &tri, const std::vector<Vec3f> &x,
                     const Vec3f &origin, float dx, int ni, int nj, int nk,
                     Array3f &phi, const int exact_band)
{
   phi.resize(ni, nj, nk);
   phi.assign((ni+nj+nk)*dx); // upper bound on distance
   Array3i closest_tri(ni, nj, nk, -1);
   Array3i intersection_count(ni, nj, nk, 0); // intersection_count(i,j,k) is # of tri intersections in (i-1,i]x{j}x{k}
   // we begin by initializing distances near the mesh, and figuring out intersection counts
   Vec3f ijkmin, ijkmax;
   for(unsigned int t=0; t<tri.size(); ++t){
     unsigned int p, q, r; assign(tri[t], p, q, r);
     // coordinates in grid to high precision
      double fip=((double)x[p][0]-origin[0])/dx, fjp=((double)x[p][1]-origin[1])/dx, fkp=((double)x[p][2]-origin[2])/dx;
      double fiq=((double)x[q][0]-origin[0])/dx, fjq=((double)x[q][1]-origin[1])/dx, fkq=((double)x[q][2]-origin[2])/dx;
      double fir=((double)x[r][0]-origin[0])/dx, fjr=((double)x[r][1]-origin[1])/dx, fkr=((double)x[r][2]-origin[2])/dx;
      // do distances nearby
      int i0=clamp(int(min(fip,fiq,fir))-exact_band, 0, ni-1), i1=clamp(int(max(fip,fiq,fir))+exact_band+1, 0, ni-1);
      int j0=clamp(int(min(fjp,fjq,fjr))-exact_band, 0, nj-1), j1=clamp(int(max(fjp,fjq,fjr))+exact_band+1, 0, nj-1);
      int k0=clamp(int(min(fkp,fkq,fkr))-exact_band, 0, nk-1), k1=clamp(int(max(fkp,fkq,fkr))+exact_band+1, 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j) for(int i=i0; i<=i1; ++i){
         Vec3f gx(i*dx+origin[0], j*dx+origin[1], k*dx+origin[2]);
         float d=point_triangle_distance(gx, x[p], x[q], x[r]);
         if(d<phi(i,j,k)){
            phi(i,j,k)=d;
            closest_tri(i,j,k)=t;
         }
      }
      // and do intersection counts
      j0=clamp((int)std::ceil(min(fjp,fjq,fjr)), 0, nj-1);
      j1=clamp((int)std::floor(max(fjp,fjq,fjr)), 0, nj-1);
      k0=clamp((int)std::ceil(min(fkp,fkq,fkr)), 0, nk-1);
      k1=clamp((int)std::floor(max(fkp,fkq,fkr)), 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j){
         double a, b, c;
         if(point_in_triangle_2d(j, k, fjp, fkp, fjq, fkq, fjr, fkr, a, b, c)){
            double fi=a*fip+b*fiq+c*fir; // intersection i coordinate
            int i_interval=int(std::ceil(fi)); // intersection is in (i_interval-1,i_interval]
            if(i_interval<0) ++intersection_count(0, j, k); // we enlarge the first interval to include everything to the -x direction
            else if(i_interval<ni) ++intersection_count(i_interval,j,k);
            // we ignore intersections that are beyond the +x side of the grid
         }
      }
   }
   // and now we fill in the rest of the distances with fast sweeping
   for(unsigned int pass=0; pass<2; ++pass){
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, +1);
   }
   // then figure out signs (inside/outside) from intersection counts
   for(int k=0; k<nk; ++k) for(int j=0; j<nj; ++j){
      int total_count=0;
      for(int i=0; i<ni; ++i){
         total_count+=intersection_count(i,j,k);
         if(total_count%2==1){ // if parity of intersections so far is odd,
            phi(i,j,k)=-phi(i,j,k); // we are inside the mesh
         }
      }
   }
}